

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtSourceHolder.cpp
# Opt level: O1

void Js::JsrtSourceHolderPolicy<bool_(*)(unsigned_long,_void_**,__JsParseScriptAttributes_*)>::
     ScriptToUtf8(ScriptContext *scriptContext,byte *script_,bool isUtf8,size_t length,
                 utf8char_t **utf8Script,size_t *utf8Length,size_t *scriptLength,
                 size_t *utf8AllocLength,bool heapAlloc)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  size_t sVar5;
  HeapAllocator *this;
  utf8char_t *puVar6;
  Recycler *this_00;
  size_t sVar7;
  undefined7 in_register_00000011;
  ulong size;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  if ((int)CONCAT71(in_register_00000011,isUtf8) == 0) {
    data._32_8_ = script_;
    if (utf8Script == (utf8char_t **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                  ,0xae,"(utf8Script != nullptr)","utf8Script != nullptr");
      if (!bVar2) goto LAB_003bdeb3;
      *puVar4 = 0;
    }
    if (utf8Length == (size_t *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                  ,0xaf,"(utf8Length != nullptr)","utf8Length != nullptr");
      if (!bVar2) goto LAB_003bdeb3;
      *puVar4 = 0;
    }
    if (scriptLength == (size_t *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                  ,0xb0,"(scriptLength != nullptr)","scriptLength != nullptr");
      if (!bVar2) goto LAB_003bdeb3;
      *puVar4 = 0;
    }
    *utf8Script = (utf8char_t *)0x0;
    *utf8Length = 0;
    *scriptLength = 0;
    if (utf8AllocLength != (size_t *)0x0) {
      *utf8AllocLength = 0;
    }
    sVar5 = PAL_wcslen((char16_t *)data._32_8_);
    if (sVar5 >> 0x20 != 0) {
LAB_003bdeb5:
      JavascriptError::ThrowOutOfMemoryError((ScriptContext *)0x0);
    }
    size = sVar5 * 3 + 3;
    if (0x55555553 < sVar5) {
      size = 0xffffffff;
    }
    if (0xfffffffe < size) goto LAB_003bdeb5;
    if (heapAlloc) {
      local_68 = (undefined1  [8])&unsigned_char::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_5a786a;
      data.filename._0_4_ = 0xd0;
      data.plusSize = size;
      this = Memory::HeapAllocator::TrackAllocInfo
                       (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_68);
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_003bdeb3;
        *puVar4 = 0;
      }
      puVar6 = (utf8char_t *)Memory::HeapAllocator::AllocT<false>(this,size);
    }
    else {
      if (scriptContext == (ScriptContext *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtSourceHolder.cpp"
                                    ,0xcb,"(scriptContext != nullptr)","scriptContext != nullptr");
        if (!bVar2) goto LAB_003bdeb3;
        *puVar4 = 0;
      }
      local_68 = (undefined1  [8])&unsigned_char::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_5a786a;
      data.filename._0_4_ = 0xcc;
      data.plusSize = size;
      this_00 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68)
      ;
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_003bdeb3;
        *puVar4 = 0;
      }
      puVar6 = (utf8char_t *)
               Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                         (this_00,size);
    }
    if (puVar6 == (utf8char_t *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_003bdeb3:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    *utf8Script = puVar6;
    sVar7 = utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)1>
                      (*utf8Script,size,(char16 *)data._32_8_,(charcount_t)sVar5);
    *utf8Length = sVar7;
    *scriptLength = sVar5;
    if (utf8AllocLength == (size_t *)0x0) {
      return;
    }
  }
  else {
    *utf8Script = script_;
    *utf8Length = length;
    *scriptLength = length;
    if (utf8AllocLength == (size_t *)0x0) {
      return;
    }
    size = 0;
  }
  *utf8AllocLength = size;
  return;
}

Assistant:

static void ScriptToUtf8(_When_(heapAlloc, _In_opt_) _When_(!heapAlloc, _In_) Js::ScriptContext *scriptContext,
            _In_z_ const byte *script_, bool isUtf8, size_t length, _Outptr_result_buffer_(*utf8Length) utf8char_t **utf8Script, _Out_ size_t *utf8Length,
            _Out_ size_t *scriptLength, _Out_opt_ size_t *utf8AllocLength, _In_ bool heapAlloc)
        {
            if (isUtf8)
            {
                *utf8Script = (utf8char_t*)script_;
                *utf8Length = length;
                *scriptLength = length; // xplat-todo: incorrect for utf8

                if (utf8AllocLength)
                {
                    *utf8AllocLength = 0;
                }
            }
            else
            {
                const WCHAR *script = (const WCHAR*) script_;
                Assert(utf8Script != nullptr);
                Assert(utf8Length != nullptr);
                Assert(scriptLength != nullptr);

                *utf8Script = nullptr;
                *utf8Length = 0;
                *scriptLength = 0;

                if (utf8AllocLength != nullptr)
                {
                    *utf8AllocLength = 0;
                }

                size_t script_length = wcslen(script);
                if (script_length > UINT_MAX)
                {
                    Js::JavascriptError::ThrowOutOfMemoryError(nullptr);
                }

                // `script_length` should not be bigger than MAXLONG
                // UINT_MAX / 3 < MAXLONG
                size_t cbUtf8Buffer = ((UINT_MAX / 3) - 1 > script_length) ? (script_length + 1) * 3 : UINT_MAX;
                if (cbUtf8Buffer >= UINT_MAX)
                {
                    Js::JavascriptError::ThrowOutOfMemoryError(nullptr);
                }

                if (!heapAlloc)
                {
                    Assert(scriptContext != nullptr);
                    *utf8Script = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), utf8char_t, cbUtf8Buffer);
                }
                else
                {
                    *utf8Script = HeapNewArray(utf8char_t, cbUtf8Buffer);
                }

                *utf8Length = utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::TrueUtf8>(*utf8Script, cbUtf8Buffer, script, static_cast<charcount_t>(script_length));
                *scriptLength = script_length;

                if (utf8AllocLength != nullptr)
                {
                    *utf8AllocLength = cbUtf8Buffer;
                }
            }
        }